

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D3MFOpcPackage.cpp
# Opt level: O1

void __thiscall
Assimp::D3MF::D3MFOpcPackage::D3MFOpcPackage
          (D3MFOpcPackage *this,IOSystem *pIOHandler,string *rFile)

{
  ZipArchiveIOSystem *pZVar1;
  size_t __n;
  pointer pbVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  ZipArchiveIOSystem *this_00;
  Logger *pLVar6;
  IOStream *pIVar7;
  runtime_error *this_01;
  long *plVar8;
  size_type *psVar9;
  D3MFOpcPackage *this_02;
  pointer pbVar10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  fileList;
  string rootFile;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c8;
  string local_1a8 [3];
  ios_base local_138 [264];
  
  this->mRootStream = (IOStream *)0x0;
  (this->mZipArchive)._M_t.
  super___uniq_ptr_impl<Assimp::ZipArchiveIOSystem,_std::default_delete<Assimp::ZipArchiveIOSystem>_>
  ._M_t.
  super__Tuple_impl<0UL,_Assimp::ZipArchiveIOSystem_*,_std::default_delete<Assimp::ZipArchiveIOSystem>_>
  .super__Head_base<0UL,_Assimp::ZipArchiveIOSystem_*,_false>._M_head_impl =
       (ZipArchiveIOSystem *)0x0;
  this_00 = (ZipArchiveIOSystem *)Intern::AllocateFromAssimpHeap::operator_new(0x28);
  ZipArchiveIOSystem::ZipArchiveIOSystem(this_00,pIOHandler,rFile,"r");
  pZVar1 = (this->mZipArchive)._M_t.
           super___uniq_ptr_impl<Assimp::ZipArchiveIOSystem,_std::default_delete<Assimp::ZipArchiveIOSystem>_>
           ._M_t.
           super__Tuple_impl<0UL,_Assimp::ZipArchiveIOSystem_*,_std::default_delete<Assimp::ZipArchiveIOSystem>_>
           .super__Head_base<0UL,_Assimp::ZipArchiveIOSystem_*,_false>._M_head_impl;
  (this->mZipArchive)._M_t.
  super___uniq_ptr_impl<Assimp::ZipArchiveIOSystem,_std::default_delete<Assimp::ZipArchiveIOSystem>_>
  ._M_t.
  super__Tuple_impl<0UL,_Assimp::ZipArchiveIOSystem_*,_std::default_delete<Assimp::ZipArchiveIOSystem>_>
  .super__Head_base<0UL,_Assimp::ZipArchiveIOSystem_*,_false>._M_head_impl = this_00;
  if (pZVar1 != (ZipArchiveIOSystem *)0x0) {
    (**(code **)((long)(pZVar1->super_IOSystem)._vptr_IOSystem + 8))();
  }
  bVar3 = ZipArchiveIOSystem::isOpen
                    ((this->mZipArchive)._M_t.
                     super___uniq_ptr_impl<Assimp::ZipArchiveIOSystem,_std::default_delete<Assimp::ZipArchiveIOSystem>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Assimp::ZipArchiveIOSystem_*,_std::default_delete<Assimp::ZipArchiveIOSystem>_>
                     .super__Head_base<0UL,_Assimp::ZipArchiveIOSystem_*,_false>._M_head_impl);
  if (!bVar3) {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_1e8,"Failed to open file ",rFile);
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_1e8);
    local_1a8[0]._M_dataplus._M_p = (pointer)*plVar8;
    psVar9 = (size_type *)(plVar8 + 2);
    if ((size_type *)local_1a8[0]._M_dataplus._M_p == psVar9) {
      local_1a8[0].field_2._0_8_ = *psVar9;
      local_1a8[0].field_2._8_8_ = plVar8[3];
      local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
    }
    else {
      local_1a8[0].field_2._0_8_ = *psVar9;
    }
    local_1a8[0]._M_string_length = plVar8[1];
    *plVar8 = (long)psVar9;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    std::runtime_error::runtime_error(this_01,(string *)local_1a8);
    *(undefined ***)this_01 = &PTR__runtime_error_0082bce0;
    __cxa_throw(this_01,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  local_1c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ZipArchiveIOSystem::getFileList
            ((this->mZipArchive)._M_t.
             super___uniq_ptr_impl<Assimp::ZipArchiveIOSystem,_std::default_delete<Assimp::ZipArchiveIOSystem>_>
             ._M_t.
             super__Tuple_impl<0UL,_Assimp::ZipArchiveIOSystem_*,_std::default_delete<Assimp::ZipArchiveIOSystem>_>
             .super__Head_base<0UL,_Assimp::ZipArchiveIOSystem_*,_false>._M_head_impl,&local_1c8);
  pbVar2 = local_1c8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_1c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_1c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar10 = local_1c8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      __n = pbVar10->_M_string_length;
      if (__n == DAT_00904630) {
        if (__n != 0) {
          iVar5 = bcmp((pbVar10->_M_dataplus)._M_p,XmlTag::ROOT_RELATIONSHIPS_ARCHIVE_abi_cxx11_,__n
                      );
          if (iVar5 != 0) goto LAB_006782bd;
        }
        pZVar1 = (this->mZipArchive)._M_t.
                 super___uniq_ptr_impl<Assimp::ZipArchiveIOSystem,_std::default_delete<Assimp::ZipArchiveIOSystem>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Assimp::ZipArchiveIOSystem_*,_std::default_delete<Assimp::ZipArchiveIOSystem>_>
                 .super__Head_base<0UL,_Assimp::ZipArchiveIOSystem_*,_false>._M_head_impl;
        cVar4 = (**(code **)((long)(pZVar1->super_IOSystem)._vptr_IOSystem + 0x10))
                          (pZVar1,(pbVar10->_M_dataplus)._M_p);
        if (cVar4 == '\0') {
          __assert_fail("mZipArchive->Exists(file.c_str())",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/3MF/D3MFOpcPackage.cpp"
                        ,0x87,
                        "Assimp::D3MF::D3MFOpcPackage::D3MFOpcPackage(IOSystem *, const std::string &)"
                       );
        }
        pZVar1 = (this->mZipArchive)._M_t.
                 super___uniq_ptr_impl<Assimp::ZipArchiveIOSystem,_std::default_delete<Assimp::ZipArchiveIOSystem>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Assimp::ZipArchiveIOSystem_*,_std::default_delete<Assimp::ZipArchiveIOSystem>_>
                 .super__Head_base<0UL,_Assimp::ZipArchiveIOSystem_*,_false>._M_head_impl;
        this_02 = (D3MFOpcPackage *)(pbVar10->_M_dataplus)._M_p;
        pIVar7 = (IOStream *)
                 (**(code **)((long)(pZVar1->super_IOSystem)._vptr_IOSystem + 0x20))
                           (pZVar1,this_02,"rb");
        if (pIVar7 == (IOStream *)0x0) {
          __assert_fail("fileStream != nullptr",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/3MF/D3MFOpcPackage.cpp"
                        ,0x8b,
                        "Assimp::D3MF::D3MFOpcPackage::D3MFOpcPackage(IOSystem *, const std::string &)"
                       );
        }
        ReadPackageRootRelationship_abi_cxx11_(local_1a8,this_02,pIVar7);
        if ((local_1a8[0]._M_string_length != 0) && (*local_1a8[0]._M_dataplus._M_p == '/')) {
          std::__cxx11::string::substr((ulong)&local_1e8,(ulong)local_1a8);
          std::__cxx11::string::operator=((string *)local_1a8,(string *)&local_1e8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
            operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
          }
          if (*local_1a8[0]._M_dataplus._M_p == '/') {
            std::__cxx11::string::substr((ulong)&local_1e8,(ulong)local_1a8);
            std::__cxx11::string::operator=((string *)local_1a8,(string *)&local_1e8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
              operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1
                             );
            }
          }
        }
        pLVar6 = DefaultLogger::get();
        Logger::debug(pLVar6,local_1a8[0]._M_dataplus._M_p);
        pZVar1 = (this->mZipArchive)._M_t.
                 super___uniq_ptr_impl<Assimp::ZipArchiveIOSystem,_std::default_delete<Assimp::ZipArchiveIOSystem>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Assimp::ZipArchiveIOSystem_*,_std::default_delete<Assimp::ZipArchiveIOSystem>_>
                 .super__Head_base<0UL,_Assimp::ZipArchiveIOSystem_*,_false>._M_head_impl;
        (**(code **)((long)(pZVar1->super_IOSystem)._vptr_IOSystem + 0x28))(pZVar1,pIVar7);
        pZVar1 = (this->mZipArchive)._M_t.
                 super___uniq_ptr_impl<Assimp::ZipArchiveIOSystem,_std::default_delete<Assimp::ZipArchiveIOSystem>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Assimp::ZipArchiveIOSystem_*,_std::default_delete<Assimp::ZipArchiveIOSystem>_>
                 .super__Head_base<0UL,_Assimp::ZipArchiveIOSystem_*,_false>._M_head_impl;
        pIVar7 = (IOStream *)
                 (**(code **)((long)(pZVar1->super_IOSystem)._vptr_IOSystem + 0x20))
                           (pZVar1,local_1a8[0]._M_dataplus._M_p,"rb");
        this->mRootStream = pIVar7;
        if (pIVar7 == (IOStream *)0x0) {
          __assert_fail("mRootStream != nullptr",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/3MF/D3MFOpcPackage.cpp"
                        ,0x9b,
                        "Assimp::D3MF::D3MFOpcPackage::D3MFOpcPackage(IOSystem *, const std::string &)"
                       );
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
          operator_delete(local_1a8[0]._M_dataplus._M_p,
                          local_1a8[0].field_2._M_allocated_capacity + 1);
        }
      }
      else {
LAB_006782bd:
        if (__n == DAT_00904610) {
          if (__n != 0) {
            iVar5 = bcmp((pbVar10->_M_dataplus)._M_p,XmlTag::CONTENT_TYPES_ARCHIVE_abi_cxx11_,__n);
            if (iVar5 != 0) goto LAB_006782e9;
          }
          pLVar6 = DefaultLogger::get();
          Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
          basic_formatter<char[56]>
                    ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_1a8,
                     (char (*) [56])"Ignored file of unsupported type CONTENT_TYPES_ARCHIVES");
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,(pbVar10->_M_dataplus)._M_p,pbVar10->_M_string_length);
          std::__cxx11::stringbuf::str();
          Logger::warn(pLVar6,local_1e8._M_dataplus._M_p);
        }
        else {
LAB_006782e9:
          pLVar6 = DefaultLogger::get();
          Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
          basic_formatter<char[31]>
                    ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_1a8,(char (*) [31])"Ignored file of unknown type: ");
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,(pbVar10->_M_dataplus)._M_p,pbVar10->_M_string_length);
          std::__cxx11::stringbuf::str();
          Logger::warn(pLVar6,local_1e8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
          operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
      }
      pbVar10 = pbVar10 + 1;
    } while (pbVar10 != pbVar2);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1c8);
  return;
}

Assistant:

D3MFOpcPackage::D3MFOpcPackage(IOSystem* pIOHandler, const std::string& rFile)
: mRootStream(nullptr)
, mZipArchive() {    
    mZipArchive.reset( new ZipArchiveIOSystem( pIOHandler, rFile ) );
    if(!mZipArchive->isOpen()) {
        throw DeadlyImportError("Failed to open file " + rFile+ ".");
    }

    std::vector<std::string> fileList;
    mZipArchive->getFileList(fileList);

    for (auto& file: fileList) {
        if(file == D3MF::XmlTag::ROOT_RELATIONSHIPS_ARCHIVE) {
            //PkgRelationshipReader pkgRelReader(file, archive);
            ai_assert(mZipArchive->Exists(file.c_str()));

            IOStream *fileStream = mZipArchive->Open(file.c_str());

            ai_assert(fileStream != nullptr);

            std::string rootFile = ReadPackageRootRelationship(fileStream);
            if ( rootFile.size() > 0 && rootFile[ 0 ] == '/' ) {
                rootFile = rootFile.substr( 1 );
                if ( rootFile[ 0 ] == '/' ) {
                    // deal with zip-bug
                    rootFile = rootFile.substr( 1 );
                }
            }

            ASSIMP_LOG_DEBUG(rootFile);

            mZipArchive->Close(fileStream);

            mRootStream = mZipArchive->Open(rootFile.c_str());
            ai_assert( mRootStream != nullptr );
            if ( nullptr == mRootStream ) {
                throw DeadlyExportError( "Cannot open root-file in archive : " + rootFile );
            }

        } else if( file == D3MF::XmlTag::CONTENT_TYPES_ARCHIVE) {
            ASSIMP_LOG_WARN_F("Ignored file of unsupported type CONTENT_TYPES_ARCHIVES",file);
        } else {
            ASSIMP_LOG_WARN_F("Ignored file of unknown type: ",file);
        }

    }
}